

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

size_t lm_trie_write_ug(lm_trie_t *trie,uint32 unigram_count,FILE *fp)

{
  size_t sVar1;
  FILE *fp_local;
  uint32 unigram_count_local;
  lm_trie_t *trie_local;
  
  sVar1 = fwrite(trie->unigrams,0xc,(ulong)(unigram_count + 1),(FILE *)fp);
  return sVar1;
}

Assistant:

static size_t
lm_trie_write_ug(lm_trie_t * trie, uint32 unigram_count, FILE * fp)
{
    if (SWAP_LM_TRIE)  {
        int i;
        for (i = 0; (uint32)i < unigram_count + 1; ++i) {
            unigram_t ug = trie->unigrams[i];
            SWAP_FLOAT32(&ug.prob);
            SWAP_FLOAT32(&ug.bo);
            SWAP_INT32(&ug.next);
            if (fwrite(&ug, sizeof(ug), 1, fp) != 1)
                return -1;
        }
        return (size_t)i;
    }
    else
        return fwrite(trie->unigrams, sizeof(*trie->unigrams),
                      (unigram_count + 1), fp);
}